

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

Status * __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::
EncodeConnectivity(Status *__return_storage_ptr__,
                  MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder> *this
                  )

{
  vector<bool,_std::allocator<bool>_> *this_00;
  CornerTable *pCVar1;
  pointer piVar2;
  pointer pTVar3;
  pointer pIVar4;
  long lVar5;
  pointer pIVar6;
  pointer data;
  __uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> __p;
  bool bVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  vector<bool,_std::allocator<bool>_> *this_01;
  pointer pIVar12;
  uint uVar13;
  CornerIndex CVar14;
  uint uVar15;
  size_type __n;
  reference rVar16;
  allocator<char> local_b5;
  CornerIndex start_corner;
  __uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> local_b0 [4];
  uint8_t num_attribute_data;
  vector<bool,_std::allocator<bool>_> *local_88;
  MeshEdgebreakerTraversalPredictiveEncoder *local_80;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  init_face_connectivity_corners;
  
  if (this->use_single_connectivity_ == true) {
    CreateCornerTableFromAllAttributes((draco *)local_b0,this->mesh_);
  }
  else {
    CreateCornerTableFromPositionAttribute((draco *)local_b0,this->mesh_);
  }
  __p._M_t.super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
  super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
       local_b0[0]._M_t.
       super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
       super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  local_b0[0]._M_t.
  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
  super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl =
       (tuple<draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)
       (_Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>)0x0;
  std::__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::reset
            ((__uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)
             &this->corner_table_,
             (pointer)__p._M_t.
                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                      .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl);
  std::unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_>::~unique_ptr
            ((unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> *)local_b0);
  pCVar1 = (this->corner_table_)._M_t.
           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>._M_t.
           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
           super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
  if ((pCVar1 == (CornerTable *)0x0) ||
     (pCVar1->num_degenerated_faces_ ==
      (int)((ulong)((long)*(pointer *)((long)&(pCVar1->corner_to_vertex_map_).vector_ + 8) -
                    *(long *)&(pCVar1->corner_to_vertex_map_).vector_ >> 2) / 3))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_b0,"All triangles are degenerate.",
               (allocator<char> *)&init_face_connectivity_corners);
    __return_storage_ptr__->code_ = DRACO_ERROR;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)local_b0);
  }
  else {
    local_80 = &this->traversal_encoder_;
    MeshEdgebreakerTraversalPredictiveEncoder::Init
              (local_80,&this->super_MeshEdgebreakerEncoderImplInterface);
    pCVar1 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    EncodeVarint<unsigned_int>
              ((int)((ulong)((long)*(pointer *)((long)&(pCVar1->vertex_corners_).vector_ + 8) -
                            *(long *)&(pCVar1->vertex_corners_).vector_.
                                      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                            ) >> 2) - pCVar1->num_isolated_vertices_,
               (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
    pCVar1 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    EncodeVarint<unsigned_int>
              ((int)((ulong)((long)*(pointer *)((long)&(pCVar1->corner_to_vertex_map_).vector_ + 8)
                             - *(long *)&(pCVar1->corner_to_vertex_map_).vector_ >> 2) / 3) -
               pCVar1->num_degenerated_faces_,
               (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
    local_88 = &this->visited_faces_;
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (local_88,((long)(this->mesh_->faces_).vector_.
                               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->mesh_->faces_).vector_.
                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffff,false);
    pCVar1 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    local_b0[0]._M_t.
    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
    super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&(this->pos_encoding_data_).vertex_to_encoded_attribute_value_index_map,
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar1->vertex_corners_).vector_ + 8)
                                  - *(long *)&(pCVar1->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),(value_type_conflict1 *)local_b0);
    pIVar12 = (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar12) {
      (this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map.
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar12;
    }
    pCVar1 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    uVar10 = (long)*(pointer *)((long)&(pCVar1->corner_to_vertex_map_).vector_ + 8) -
             *(long *)&(pCVar1->corner_to_vertex_map_).vector_ >> 2;
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(&(this->pos_encoding_data_).encoded_attribute_value_index_to_corner_map,
              (long)((int)uVar10 - (int)(uVar10 % 3)));
    this_00 = &this->visited_vertex_ids_;
    pCVar1 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
              (this_00,(long)(int)((ulong)((long)*(pointer *)
                                                  ((long)&(pCVar1->vertex_corners_).vector_ + 8) -
                                          *(long *)&(pCVar1->vertex_corners_).vector_.
                                                                                                        
                                                  super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                          ) >> 2),false);
    piVar2 = (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->vertex_traversal_length_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    this->last_encoded_symbol_id_ = -1;
    this->num_split_symbols_ = 0;
    pTVar3 = (this->topology_split_event_data_).
             super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->topology_split_event_data_).
        super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
        ._M_impl.super__Vector_impl_data._M_finish != pTVar3) {
      (this->topology_split_event_data_).
      super__Vector_base<draco::TopologySplitEventData,_std::allocator<draco::TopologySplitEventData>_>
      ._M_impl.super__Vector_impl_data._M_finish = pTVar3;
    }
    std::
    _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&(this->face_to_split_symbol_map_)._M_h);
    pCVar1 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    (this->visited_holes_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    local_b0[0]._M_t.
    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
    super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ = 0xffffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->vertex_hole_id_,
               (long)(int)((ulong)((long)*(pointer *)((long)&(pCVar1->vertex_corners_).vector_ + 8)
                                  - *(long *)&(pCVar1->vertex_corners_).vector_.
                                              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                  ) >> 2),(value_type_conflict1 *)local_b0);
    pIVar12 = (this->processed_connectivity_corners_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->processed_connectivity_corners_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar12) {
      (this->processed_connectivity_corners_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar12;
    }
    pCVar1 = (this->corner_table_)._M_t.
             super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>.
             _M_t.
             super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>.
             super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::reserve(&this->processed_connectivity_corners_,
              (long)(int)((ulong)((long)*(pointer *)
                                         ((long)&(pCVar1->corner_to_vertex_map_).vector_ + 8) -
                                  *(long *)&(pCVar1->corner_to_vertex_map_).vector_ >> 2) / 3));
    (this->pos_encoding_data_).num_values = 0;
    bVar7 = FindHoles(this);
    if (bVar7) {
      bVar7 = InitAttributeData(this);
      if (bVar7) {
        num_attribute_data =
             (uint8_t)(((long)(this->attribute_data_).
                              super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->attribute_data_).
                             super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0x130);
        EncoderBuffer::Encode<unsigned_char>
                  ((this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_,
                   &num_attribute_data);
        (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.num_attribute_data_ =
             (uint)num_attribute_data;
        pCVar1 = (this->corner_table_)._M_t.
                 super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                 .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl;
        pIVar4 = *(pointer *)((long)&(pCVar1->corner_to_vertex_map_).vector_ + 8);
        lVar5 = *(long *)&(pCVar1->corner_to_vertex_map_).vector_;
        MeshEdgebreakerTraversalEncoder::Start(&local_80->super_MeshEdgebreakerTraversalEncoder);
        init_face_connectivity_corners.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        init_face_connectivity_corners.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        init_face_connectivity_corners.
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        uVar13 = 0;
        uVar15 = (uint)((ulong)((long)pIVar4 - lVar5) >> 2);
        this_01 = local_88;
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        do {
          if (uVar15 == uVar13) {
            std::
            __reverse<__gnu_cxx::__normal_iterator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>*,std::vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>>
                      ((this->processed_connectivity_corners_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->processed_connectivity_corners_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
            std::
            vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
            ::
            insert<__gnu_cxx::__normal_iterator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>*,std::vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>>,void>
                      ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                        *)&this->processed_connectivity_corners_,
                       (this->processed_connectivity_corners_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (__normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                        )init_face_connectivity_corners.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                       (__normal_iterator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_*,_std::vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>_>
                        )init_face_connectivity_corners.
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
            if ((this->attribute_data_).
                super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (this->attribute_data_).
                super__Vector_base<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData,_std::allocator<draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalPredictiveEncoder>::AttributeData>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              std::vector<bool,_std::allocator<bool>_>::_M_fill_assign
                        (this_01,((long)(this->mesh_->faces_).vector_.
                                        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->mesh_->faces_).vector_.
                                       super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffff
                         ,false);
              pIVar6 = (this->processed_connectivity_corners_).
                       super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              for (pIVar12 = (this->processed_connectivity_corners_).
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start; pIVar12 != pIVar6;
                  pIVar12 = pIVar12 + 1) {
                EncodeAttributeConnectivitiesOnFace(this,(CornerIndex)pIVar12->value_);
              }
            }
            MeshEdgebreakerTraversalPredictiveEncoder::Done(local_80);
            EncodeVarint<unsigned_int>
                      ((this->traversal_encoder_).num_symbols_,
                       (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
            EncodeVarint<unsigned_int>
                      (this->num_split_symbols_,
                       (this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_);
            bVar7 = EncodeSplitData(this);
            if (bVar7) {
              data = (this->traversal_encoder_).super_MeshEdgebreakerTraversalEncoder.
                     traversal_buffer_.buffer_.super__Vector_base<char,_std::allocator<char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
              EncoderBuffer::Encode
                        ((this->encoder_->super_MeshEncoder).super_PointCloudEncoder.buffer_,data,
                         (long)*(pointer *)
                                ((long)&(this->traversal_encoder_).
                                        super_MeshEdgebreakerTraversalEncoder.traversal_buffer_.
                                        buffer_.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data + 8) - (long)data);
              __return_storage_ptr__->code_ = OK;
              (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
                   (pointer)&(__return_storage_ptr__->error_msg_).field_2;
              (__return_storage_ptr__->error_msg_)._M_string_length = 0;
              (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
            }
            else {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)local_b0,"Failed to encode split data.",
                         (allocator<char> *)&start_corner);
              __return_storage_ptr__->code_ = DRACO_ERROR;
              std::__cxx11::string::string
                        ((string *)&__return_storage_ptr__->error_msg_,(string *)local_b0);
LAB_00134d3f:
              std::__cxx11::string::~string((string *)local_b0);
            }
            std::
            _Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
            ::~_Vector_base(&init_face_connectivity_corners.
                             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                           );
            return __return_storage_ptr__;
          }
          uVar10 = (ulong)uVar13 / 3;
          rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_01,uVar10);
          if ((*rVar16._M_p & rVar16._M_mask) == 0) {
            bVar7 = CornerTable::IsDegenerated
                              ((this->corner_table_)._M_t.
                               super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                               .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl,
                               (FaceIndex)(uint)uVar10);
            if (!bVar7) {
              start_corner.value_ = 0;
              bVar7 = FindInitFaceConfiguration(this,(FaceIndex)(uint)uVar10,&start_corner);
              RAnsBitEncoder::EncodeBit((RAnsBitEncoder *)local_80,bVar7);
              CVar14 = start_corner;
              if (bVar7) {
                uVar11 = 0xffffffff;
                __n = 0xffffffff;
                uVar9 = uVar11;
                if (start_corner.value_ != 0xffffffff) {
                  uVar8 = start_corner.value_ + 1;
                  if (uVar8 % 3 == 0) {
                    uVar8 = start_corner.value_ - 2;
                  }
                  lVar5 = *(long *)&(((this->corner_table_)._M_t.
                                      super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                      .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                     _M_head_impl)->corner_to_vertex_map_).vector_;
                  uVar9 = *(uint *)(lVar5 + (ulong)start_corner.value_ * 4);
                  if (uVar8 != 0xffffffff) {
                    uVar11 = *(uint *)(lVar5 + (ulong)uVar8 * 4);
                  }
                  if (start_corner.value_ % 3 == 0) {
                    uVar8 = start_corner.value_ + 2;
                    if (uVar8 == 0xffffffff) goto LAB_00134ab9;
                  }
                  else {
                    uVar8 = start_corner.value_ - 1;
                  }
                  __n = (size_type)*(uint *)(lVar5 + (ulong)uVar8 * 4);
                }
LAB_00134ab9:
                rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)uVar9);
                *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
                rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)uVar11)
                ;
                *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
                rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
                *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
                local_b0[0]._M_t.
                super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ = 1;
                std::vector<int,_std::allocator<int>_>::emplace_back<int>
                          (&this->vertex_traversal_length_,(int *)local_b0);
                rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[](local_88,uVar10);
                *rVar16._M_p = *rVar16._M_p | rVar16._M_mask;
                local_b0[0]._M_t.
                super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ = 0xffffffff;
                if ((CVar14.value_ != 0xffffffff) &&
                   (local_b0[0]._M_t.
                    super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                    .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ =
                         CVar14.value_ + 1,
                   (uint)local_b0[0]._M_t.
                         super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                         .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl % 3 == 0))
                {
                  local_b0[0]._M_t.
                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                  .super__Head_base<0UL,_draco::CornerTable_*,_false>._M_head_impl._0_4_ =
                       CVar14.value_ - 2;
                }
                std::
                vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                ::emplace_back<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>
                          ((vector<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>,std::allocator<draco::IndexType<unsigned_int,draco::CornerIndex_tag_type_>>>
                            *)&init_face_connectivity_corners,
                           (IndexType<unsigned_int,_draco::CornerIndex_tag_type_> *)local_b0);
                this_01 = local_88;
                if (CVar14.value_ != 0xffffffff) {
                  uVar9 = CVar14.value_ + 1;
                  if (uVar9 % 3 == 0) {
                    uVar9 = CVar14.value_ - 2;
                  }
                  if ((((uVar9 != 0xffffffff) &&
                       (CVar14.value_ =
                             *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                                                                                      
                                                  super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                                  .
                                                  super__Head_base<0UL,_draco::CornerTable_*,_false>
                                                  ._M_head_impl)->opposite_corners_).vector_.
                                                 super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                                      + (ulong)uVar9 * 4), CVar14.value_ != 0xffffffff)) &&
                      (rVar16 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                          (local_88,(ulong)CVar14.value_ / 3), this_01 = local_88,
                      (*rVar16._M_p & rVar16._M_mask) == 0)) &&
                     (bVar7 = EncodeConnectivityFromCorner(this,CVar14), this_01 = local_88, !bVar7)
                     ) {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)local_b0,"Failed to encode mesh component.",&local_b5);
                    __return_storage_ptr__->code_ = DRACO_ERROR;
                    std::__cxx11::string::string
                              ((string *)&__return_storage_ptr__->error_msg_,(string *)local_b0);
                    goto LAB_00134d3f;
                  }
                }
              }
              else {
                CVar14.value_ = 0xffffffff;
                if ((start_corner.value_ != 0xffffffff) &&
                   (CVar14.value_ = start_corner.value_ + 1, CVar14.value_ % 3 == 0)) {
                  CVar14.value_ = start_corner.value_ - 2;
                }
                EncodeHole(this,CVar14,true);
                bVar7 = EncodeConnectivityFromCorner(this,start_corner);
                this_01 = local_88;
                if (!bVar7) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_b0,"Failed to encode mesh component.",&local_b5);
                  __return_storage_ptr__->code_ = DRACO_ERROR;
                  std::__cxx11::string::string
                            ((string *)&__return_storage_ptr__->error_msg_,(string *)local_b0);
                  goto LAB_00134d3f;
                }
              }
            }
          }
          uVar13 = uVar13 + 1;
        } while( true );
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b0,"Failed to initialize attribute data.",
                 (allocator<char> *)&init_face_connectivity_corners);
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)local_b0)
      ;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b0,"Failed to process mesh holes.",
                 (allocator<char> *)&init_face_connectivity_corners);
      __return_storage_ptr__->code_ = DRACO_ERROR;
      std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)local_b0)
      ;
    }
  }
  std::__cxx11::string::~string((string *)local_b0);
  return __return_storage_ptr__;
}

Assistant:

Status MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivity() {
  // To encode the mesh, we need face connectivity data stored in a corner
  // table. To compute the connectivity we must use indices associated with
  // POSITION attribute, because they define which edges can be connected
  // together, unless the option |use_single_connectivity_| is set in which case
  // we break the mesh along attribute seams and use the same connectivity for
  // all attributes.
  if (use_single_connectivity_) {
    corner_table_ = CreateCornerTableFromAllAttributes(mesh_);
  } else {
    corner_table_ = CreateCornerTableFromPositionAttribute(mesh_);
  }
  if (corner_table_ == nullptr ||
      corner_table_->num_faces() == corner_table_->NumDegeneratedFaces()) {
    // Failed to construct the corner table.
    // TODO(ostava): Add better error reporting.
    return Status(Status::DRACO_ERROR, "All triangles are degenerate.");
  }

  traversal_encoder_.Init(this);

  // Also encode the total number of vertices that is going to be encoded.
  // This can be different from the mesh_->num_points() + num_new_vertices,
  // because some of the vertices of the input mesh can be ignored (e.g.
  // vertices on degenerated faces or isolated vertices not attached to any
  // face).
  const uint32_t num_vertices_to_be_encoded =
      corner_table_->num_vertices() - corner_table_->NumIsolatedVertices();
  EncodeVarint(num_vertices_to_be_encoded, encoder_->buffer());

  const uint32_t num_faces =
      corner_table_->num_faces() - corner_table_->NumDegeneratedFaces();
  EncodeVarint(num_faces, encoder_->buffer());

  // Reset encoder data that may have been initialized in previous runs.
  visited_faces_.assign(mesh_->num_faces(), false);
  pos_encoding_data_.vertex_to_encoded_attribute_value_index_map.assign(
      corner_table_->num_vertices(), -1);
  pos_encoding_data_.encoded_attribute_value_index_to_corner_map.clear();
  pos_encoding_data_.encoded_attribute_value_index_to_corner_map.reserve(
      corner_table_->num_faces() * 3);
  visited_vertex_ids_.assign(corner_table_->num_vertices(), false);
  vertex_traversal_length_.clear();
  last_encoded_symbol_id_ = -1;
  num_split_symbols_ = 0;
  topology_split_event_data_.clear();
  face_to_split_symbol_map_.clear();
  visited_holes_.clear();
  vertex_hole_id_.assign(corner_table_->num_vertices(), -1);
  processed_connectivity_corners_.clear();
  processed_connectivity_corners_.reserve(corner_table_->num_faces());
  pos_encoding_data_.num_values = 0;

  if (!FindHoles()) {
    return Status(Status::DRACO_ERROR, "Failed to process mesh holes.");
  }

  if (!InitAttributeData()) {
    return Status(Status::DRACO_ERROR, "Failed to initialize attribute data.");
  }

  const uint8_t num_attribute_data =
      static_cast<uint8_t>(attribute_data_.size());
  encoder_->buffer()->Encode(num_attribute_data);
  traversal_encoder_.SetNumAttributeData(num_attribute_data);

  const int num_corners = corner_table_->num_corners();

  traversal_encoder_.Start();

  std::vector<CornerIndex> init_face_connectivity_corners;
  // Traverse the surface starting from each unvisited corner.
  for (int c_id = 0; c_id < num_corners; ++c_id) {
    CornerIndex corner_index(c_id);
    const FaceIndex face_id = corner_table_->Face(corner_index);
    if (visited_faces_[face_id.value()]) {
      continue;  // Face has been already processed.
    }
    if (corner_table_->IsDegenerated(face_id)) {
      continue;  // Ignore degenerated faces.
    }

    CornerIndex start_corner;
    const bool interior_config =
        FindInitFaceConfiguration(face_id, &start_corner);
    traversal_encoder_.EncodeStartFaceConfiguration(interior_config);

    if (interior_config) {
      // Select the correct vertex on the face as the root.
      corner_index = start_corner;
      const VertexIndex vert_id = corner_table_->Vertex(corner_index);
      // Mark all vertices of a given face as visited.
      const VertexIndex next_vert_id =
          corner_table_->Vertex(corner_table_->Next(corner_index));
      const VertexIndex prev_vert_id =
          corner_table_->Vertex(corner_table_->Previous(corner_index));

      visited_vertex_ids_[vert_id.value()] = true;
      visited_vertex_ids_[next_vert_id.value()] = true;
      visited_vertex_ids_[prev_vert_id.value()] = true;
      // New traversal started. Initiate it's length with the first vertex.
      vertex_traversal_length_.push_back(1);

      // Mark the face as visited.
      visited_faces_[face_id.value()] = true;
      // Start compressing from the opposite face of the "next" corner. This way
      // the first encoded corner corresponds to the tip corner of the regular
      // edgebreaker traversal (essentially the initial face can be then viewed
      // as a TOPOLOGY_C face).
      init_face_connectivity_corners.push_back(
          corner_table_->Next(corner_index));
      const CornerIndex opp_id =
          corner_table_->Opposite(corner_table_->Next(corner_index));
      const FaceIndex opp_face_id = corner_table_->Face(opp_id);
      if (opp_face_id != kInvalidFaceIndex &&
          !visited_faces_[opp_face_id.value()]) {
        if (!EncodeConnectivityFromCorner(opp_id)) {
          return Status(Status::DRACO_ERROR,
                        "Failed to encode mesh component.");
        }
      }
    } else {
      // Boundary configuration. We start on a boundary rather than on a face.
      // First encode the hole that's opposite to the start_corner.
      EncodeHole(corner_table_->Next(start_corner), true);
      // Start processing the face opposite to the boundary edge (the face
      // containing the start_corner).
      if (!EncodeConnectivityFromCorner(start_corner)) {
        return Status(Status::DRACO_ERROR, "Failed to encode mesh component.");
      }
    }
  }
  // Reverse the order of connectivity corners to match the order in which
  // they are going to be decoded.
  std::reverse(processed_connectivity_corners_.begin(),
               processed_connectivity_corners_.end());
  // Append the init face connectivity corners (which are processed in order by
  // the decoder after the regular corners.
  processed_connectivity_corners_.insert(processed_connectivity_corners_.end(),
                                         init_face_connectivity_corners.begin(),
                                         init_face_connectivity_corners.end());
  // Encode connectivity for all non-position attributes.
  if (!attribute_data_.empty()) {
    // Use the same order of corner that will be used by the decoder.
    visited_faces_.assign(mesh_->num_faces(), false);
    for (CornerIndex ci : processed_connectivity_corners_) {
      EncodeAttributeConnectivitiesOnFace(ci);
    }
  }
  traversal_encoder_.Done();

  // Encode the number of symbols.
  const uint32_t num_encoded_symbols =
      static_cast<uint32_t>(traversal_encoder_.NumEncodedSymbols());
  EncodeVarint(num_encoded_symbols, encoder_->buffer());

  // Encode the number of split symbols.
  EncodeVarint(num_split_symbols_, encoder_->buffer());

  // Append the traversal buffer.
  if (!EncodeSplitData()) {
    return Status(Status::DRACO_ERROR, "Failed to encode split data.");
  }
  encoder_->buffer()->Encode(traversal_encoder_.buffer().data(),
                             traversal_encoder_.buffer().size());

  return OkStatus();
}